

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O0

void __thiscall IsoWriter::writeLogicalVolumeDescriptor(IsoWriter *this)

{
  undefined2 uVar1;
  uint32_t tagLocation;
  int iVar2;
  uint8_t *buffer;
  char *pcVar3;
  undefined2 in_CX;
  undefined6 in_register_0000000a;
  uint32_t mirrorHeaderLocation;
  uint16_t *buff16;
  uint32_t *buff32;
  IsoWriter *this_local;
  
  memset(this->m_buffer,0,0x800);
  tagLocation = absoluteSectorNum(this);
  anon_unknown.dwarf_b4dde::writeDescriptorTag(this->m_buffer,LogicalVol,tagLocation);
  this->m_buffer[0x10] = '\x03';
  this->m_buffer[0x11] = '\0';
  this->m_buffer[0x12] = '\0';
  this->m_buffer[0x13] = '\0';
  strcpy((char *)(this->m_buffer + 0x15),"OSTA Compressed Unicode");
  buffer = (uint8_t *)std::__cxx11::string::c_str();
  anon_unknown.dwarf_b4dde::writeDString
            ((anon_unknown_dwarf_b4dde *)(this->m_buffer + 0x54),buffer,(char *)0x80,
             CONCAT62(in_register_0000000a,in_CX));
  this->m_buffer[0xd4] = '\0';
  this->m_buffer[0xd5] = '\b';
  this->m_buffer[0xd6] = '\0';
  this->m_buffer[0xd7] = '\0';
  anon_unknown.dwarf_b4dde::writeUDFString(this->m_buffer + 0xd8,"*OSTA UDF Compliant",0x20);
  this->m_buffer[0xf2] = '\x03';
  this->m_buffer[0xf9] = '\x10';
  this->m_buffer[0x100] = '\x01';
  this->m_buffer[0x108] = 'F';
  this->m_buffer[0x10c] = '\x02';
  pcVar3 = (char *)std::__cxx11::string::c_str();
  strcpy((char *)(this->m_buffer + 0x111),pcVar3);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  strcpy((char *)(this->m_buffer + 0x130),pcVar3);
  this->m_buffer[0x1b0] = '\0';
  this->m_buffer[0x1b1] = 0x80;
  this->m_buffer[0x1b2] = '\0';
  this->m_buffer[0x1b3] = '\0';
  this->m_buffer[0x1b4] = '@';
  this->m_buffer[0x1b5] = '\0';
  this->m_buffer[0x1b6] = '\0';
  this->m_buffer[0x1b7] = '\0';
  this->m_buffer[0x1b8] = '\x01';
  this->m_buffer[0x1b9] = '\x06';
  this->m_buffer[0x1ba] = '\x01';
  this->m_buffer[0x1bb] = '\0';
  this->m_buffer[0x1bc] = '\0';
  this->m_buffer[0x1bd] = '\0';
  this->m_buffer[0x1be] = '\x02';
  this->m_buffer[0x1bf] = '@';
  anon_unknown.dwarf_b4dde::writeUDFString(this->m_buffer + 0x1c2,"*UDF Metadata Partition",0x20);
  this->m_buffer[0x1e2] = '\x01';
  this->m_buffer[0x1e3] = '\0';
  this->m_buffer[0x1e4] = '\0';
  this->m_buffer[0x1e5] = '\0';
  this->m_buffer[0x1e6] = '\0';
  this->m_buffer[0x1e7] = '\0';
  this->m_buffer[0x1e8] = '\0';
  this->m_buffer[0x1e9] = '\0';
  iVar2 = (this->m_metadataMirrorLBN + -1) - this->m_partitionStartAddress;
  uVar1 = (undefined2)((uint)iVar2 >> 0x10);
  *(int *)(this->m_buffer + 0x1ea) = iVar2;
  this->m_buffer[0x1ee] = 0xff;
  this->m_buffer[0x1ef] = 0xff;
  this->m_buffer[0x1f0] = 0xff;
  this->m_buffer[0x1f1] = 0xff;
  this->m_buffer[0x1f2] = ' ';
  this->m_buffer[499] = '\0';
  this->m_buffer[500] = '\0';
  this->m_buffer[0x1f5] = '\0';
  this->m_buffer[0x1f6] = ' ';
  this->m_buffer[0x1f7] = '\0';
  this->m_buffer[0x1f8] = '\x01';
  anon_unknown.dwarf_b4dde::calcDescriptorCRC(this->m_buffer,0x1fe);
  File::write(&this->m_file,(int)this + 0xa0,(void *)0x800,CONCAT62(in_register_0000000a,uVar1));
  return;
}

Assistant:

void IsoWriter::writeLogicalVolumeDescriptor()
{
    memset(m_buffer, 0, sizeof(m_buffer));
    writeDescriptorTag(m_buffer, DescriptorTag::LogicalVol, absoluteSectorNum());
    const auto buff32 = reinterpret_cast<uint32_t *>(m_buffer);
    const auto buff16 = reinterpret_cast<uint16_t *>(m_buffer);

    buff32[4] = 0x03;                                                            // Volume Descriptor Sequence Number
    strcpy(reinterpret_cast<char *>(m_buffer) + 21, "OSTA Compressed Unicode");  // Descriptor Character Set
    // Logical Volume Identifier
    writeDString(m_buffer + 84, m_volumeLabel.c_str(), 128);
    buff32[212 / 4] = SECTOR_SIZE;                              // Logical Block Size
    writeUDFString(m_buffer + 216, "*OSTA UDF Compliant", 32);  // Domain Identifier

    // Domain Flags #03: Hard and Soft Write-Protect
    m_buffer[242] = 0x03;

    // Logical Volume Contents Use
    m_buffer[249] = 0x10;
    m_buffer[256] = 0x01;

    m_buffer[264] = 0x46;  // partition Map Table Length ( in bytes)
    m_buffer[268] = 0x02;  // Number of Partition Maps.

    // Implementation Identifier
    strcpy(reinterpret_cast<char *>(m_buffer) + 273, m_impId.c_str());
    strcpy(reinterpret_cast<char *>(m_buffer) + 304, m_appId.c_str());

    // Integrity Sequence Extent
    buff32[432 / 4] = 0x8000;
    buff32[436 / 4] = 0x40;

    // Partition Maps
    m_buffer[440] = 0x01;    // Type 1 Partition Map
    m_buffer[441] = 0x06;    // map len
    buff16[442 / 2] = 0x01;  // Volume Sequence Number
    buff16[444 / 2] = 0x00;  // Partition Number

    m_buffer[446] = 0x02;  // Type 2 Partition Map
    m_buffer[447] = 64;    // map len
    writeUDFString(m_buffer + 450, "*UDF Metadata Partition", 32);

    buff16[482 / 2] = 0x01;  // Volume Sequence Number
    buff16[484 / 2] = 0x00;  // Partition Number
    buff16[486 / 2] = 0x00;  // Metadata File Location
    buff16[488 / 2] = 0x00;  // Metadata File Location
    // Metadata Mirror File Location, to    do: fill me. should be written here in future
    const uint32_t mirrorHeaderLocation = (m_metadataMirrorLBN - 1 - m_partitionStartAddress);
    buff16[490 / 2] = static_cast<uint16_t>(mirrorHeaderLocation % 65536);
    buff16[492 / 2] = mirrorHeaderLocation / 65536;

    // Metadata Bitmap File Location
    buff16[494 / 2] = 0xffff;
    buff16[496 / 2] = 0xffff;

    buff16[498 / 2] = 0x20;  // Allocation Unit Size (blocks) (64K in bytes)
    buff16[500 / 2] = 0x00;  // Allocation Unit Size (blocks)
    buff16[502 / 2] = 0x20;  // Alignment Unit Size (blocks) (64K in bytes)
    m_buffer[504] = 0x01;    // Flags

    calcDescriptorCRC(m_buffer, 510);
    m_file.write(m_buffer, SECTOR_SIZE);
}